

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::iterate(ComputeBuiltinVarCase *this)

{
  GLuint GVar1;
  GLuint GVar2;
  glBindBufferFunc p_Var3;
  glBindBufferBaseFunc p_Var4;
  glUniform2uivFunc p_Var5;
  glDispatchComputeFunc p_Var6;
  bool bVar7;
  int iVar8;
  deUint32 program_00;
  deBool dVar9;
  deUint32 dVar10;
  GLenum GVar11;
  GLint GVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  qpTestResult qVar18;
  TestLog *pTVar19;
  RenderContext *pRVar20;
  undefined4 extraout_var;
  reference localSize;
  uint *puVar21;
  TestError *pTVar22;
  MessageBuilder *pMVar23;
  void *pvVar24;
  size_type sVar25;
  uint local_9c4;
  MessageBuilder local_9c0;
  MessageBuilder local_840;
  LogComps local_6c0;
  LogComps local_6b0;
  MessageBuilder local_6a0;
  undefined1 local_51c [8];
  UVec3 resValue;
  deUint32 *resPtr;
  UVec3 refValue;
  deUint32 refOffset;
  undefined1 local_4e8 [8];
  UVec3 refGlobalID;
  UVec3 refLocalID;
  UVec3 refGroupID;
  deUint32 localX;
  deUint32 localY;
  deUint32 localZ;
  deUint32 groupX;
  deUint32 groupY;
  deUint32 groupZ;
  int maxLogPrints;
  int numScalars;
  int numFailed;
  void *ptr;
  MessageBuilder local_318;
  undefined1 local_198 [8];
  Buffer outputBuffer;
  undefined1 local_178 [4];
  deUint32 bufferSize;
  InterfaceVariableInfo outVarInfo;
  deUint32 outVarIndex;
  deUint32 numInvocations;
  UVec2 stride;
  UVec3 globalSize;
  deUint32 program;
  SubCase *subCase;
  Functions *gl;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ScopedLogSection local_18;
  ScopedLogSection section;
  ComputeBuiltinVarCase *this_local;
  Functions *gl_00;
  
  section.m_log = (TestLog *)this;
  pTVar19 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Iteration",&local_59);
  de::toString<int>(&local_90,&this->m_subCaseNdx);
  std::operator+(&local_38,&local_58,&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Iteration ",&local_d1);
  de::toString<int>((string *)&gl,&this->m_subCaseNdx);
  std::operator+(&local_b0,&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl);
  tcu::ScopedLogSection::ScopedLogSection(&local_18,pTVar19,&local_38,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pRVar20 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar20->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar8);
  localSize = std::
              vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
              ::operator[](&this->m_subCases,(long)this->m_subCaseNdx);
  program_00 = getProgram(this,&localSize->localSize);
  tcu::operator*((tcu *)&stride,&localSize->localSize,&localSize->numWorkGroups);
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)&stride,0);
  uVar13 = *puVar21;
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)&stride,1);
  uVar14 = *puVar21;
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)&stride,0);
  tcu::Vector<unsigned_int,_2>::Vector
            ((Vector<unsigned_int,_2> *)&outVarIndex,uVar13 * uVar14,*puVar21);
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->localSize,0);
  uVar13 = *puVar21;
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->localSize,1);
  uVar14 = *puVar21;
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->localSize,2);
  uVar15 = *puVar21;
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->numWorkGroups,0);
  uVar16 = *puVar21;
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->numWorkGroups,1);
  uVar17 = *puVar21;
  puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->numWorkGroups,2);
  outVarInfo._76_4_ = uVar13 * uVar14 * uVar15 * uVar16 * uVar17 * *puVar21;
  outVarInfo._72_4_ = (*gl_00->getProgramResourceIndex)(program_00,0x92e5,"Output.result");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_178,gl_00,program_00,0x92e5,outVarInfo._72_4_);
  outputBuffer.super_ObjectWrapper._20_4_ = outVarInfo._76_4_ * outVarInfo.arraySize;
  pRVar20 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_198,pRVar20);
  while ((dVar9 = ::deGetFalse(), dVar9 == 0 && (outVarInfo.atomicCounterBufferIndex == 0))) {
    dVar9 = ::deGetFalse();
    if (dVar9 == 0) {
      pTVar19 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&ptr,pTVar19,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&ptr,(char (*) [25])"Number of work groups = ");
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&localSize->numWorkGroups);
      pTVar19 = tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_318,pTVar19,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<(&local_318,(char (*) [19])"Work group size = ");
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&localSize->localSize);
      tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_318);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ptr);
      p_Var3 = gl_00->bindBuffer;
      dVar10 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_198);
      (*p_Var3)(0x90d2,dVar10);
      (*gl_00->bufferData)
                (0x90d2,(ulong)(uint)outputBuffer.super_ObjectWrapper._20_4_,(void *)0x0,0x88e1);
      p_Var4 = gl_00->bindBufferBase;
      dVar10 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_198);
      (*p_Var4)(0x90d2,0,dVar10);
      GVar11 = (*gl_00->getError)();
      glu::checkError(GVar11,"Buffer setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                      ,0xe5);
      (*gl_00->useProgram)(program_00);
      p_Var5 = gl_00->uniform2uiv;
      GVar12 = (*gl_00->getUniformLocation)(program_00,"u_stride");
      puVar21 = tcu::Vector<unsigned_int,_2>::getPtr((Vector<unsigned_int,_2> *)&outVarIndex);
      (*p_Var5)(GVar12,1,puVar21);
      GVar11 = (*gl_00->getError)();
      glu::checkError(GVar11,"Program setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                      ,0xe9);
      p_Var6 = gl_00->dispatchCompute;
      puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->numWorkGroups,0);
      GVar1 = *puVar21;
      puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->numWorkGroups,1);
      GVar2 = *puVar21;
      puVar21 = tcu::Vector<unsigned_int,_3>::operator[](&localSize->numWorkGroups,2);
      (*p_Var6)(GVar1,GVar2,*puVar21);
      GVar11 = (*gl_00->getError)();
      glu::checkError(GVar11,"glDispatchCompute() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                      ,0xec);
      pvVar24 = (*gl_00->mapBufferRange)
                          (0x90d2,0,(ulong)(uint)outputBuffer.super_ObjectWrapper._20_4_,1);
      maxLogPrints = 0;
      iVar8 = glu::getDataTypeScalarSize(this->m_varType);
      GVar11 = (*gl_00->getError)();
      glu::checkError(GVar11,"glMapBufferRange() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                      ,0xf4);
      while ((dVar9 = ::deGetFalse(), dVar9 == 0 && (pvVar24 != (void *)0x0))) {
        dVar9 = ::deGetFalse();
        if (dVar9 == 0) {
          for (groupX = 0; uVar13 = tcu::Vector<unsigned_int,_3>::z(&localSize->numWorkGroups),
              groupX < uVar13; groupX = groupX + 1) {
            for (localZ = 0; uVar13 = tcu::Vector<unsigned_int,_3>::y(&localSize->numWorkGroups),
                localZ < uVar13; localZ = localZ + 1) {
              for (localY = 0; uVar13 = tcu::Vector<unsigned_int,_3>::x(&localSize->numWorkGroups),
                  localY < uVar13; localY = localY + 1) {
                for (localX = 0; uVar13 = tcu::Vector<unsigned_int,_3>::z(&localSize->localSize),
                    localX < uVar13; localX = localX + 1) {
                  for (refGroupID.m_data[2] = 0;
                      uVar13 = tcu::Vector<unsigned_int,_3>::y(&localSize->localSize),
                      refGroupID.m_data[2] < uVar13; refGroupID.m_data[2] = refGroupID.m_data[2] + 1
                      ) {
                    for (refGroupID.m_data[1] = 0;
                        uVar13 = tcu::Vector<unsigned_int,_3>::x(&localSize->localSize),
                        refGroupID.m_data[1] < uVar13;
                        refGroupID.m_data[1] = refGroupID.m_data[1] + 1) {
                      tcu::Vector<unsigned_int,_3>::Vector
                                ((Vector<unsigned_int,_3> *)(refLocalID.m_data + 1),localY,localZ,
                                 groupX);
                      tcu::Vector<unsigned_int,_3>::Vector
                                ((Vector<unsigned_int,_3> *)(refGlobalID.m_data + 1),
                                 refGroupID.m_data[1],refGroupID.m_data[2],localX);
                      tcu::operator*((tcu *)(refValue.m_data + 2),
                                     (Vector<unsigned_int,_3> *)(refLocalID.m_data + 1),
                                     &localSize->localSize);
                      tcu::operator+((tcu *)local_4e8,
                                     (Vector<unsigned_int,_3> *)(refValue.m_data + 2),
                                     (Vector<unsigned_int,_3> *)(refGlobalID.m_data + 1));
                      uVar13 = tcu::Vector<unsigned_int,_2>::x
                                         ((Vector<unsigned_int,_2> *)&outVarIndex);
                      uVar14 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_4e8)
                      ;
                      uVar15 = tcu::Vector<unsigned_int,_2>::y
                                         ((Vector<unsigned_int,_2> *)&outVarIndex);
                      uVar16 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_4e8)
                      ;
                      uVar17 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_4e8)
                      ;
                      refValue.m_data[1] = uVar13 * uVar14 + uVar15 * uVar16 + uVar17;
                      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                                ((long)&resPtr + 4,this,&localSize->numWorkGroups,localSize,
                                 refLocalID.m_data + 1,refGlobalID.m_data + 1);
                      resValue.m_data._4_8_ =
                           (long)pvVar24 + (ulong)(refValue.m_data[1] * outVarInfo.arraySize);
                      readResultVec((Functional *)local_51c,(deUint32 *)resValue.m_data._4_8_,iVar8)
                      ;
                      bVar7 = compareComps((UVec3 *)((long)&resPtr + 4),(UVec3 *)local_51c,iVar8);
                      if (!bVar7) {
                        if (maxLogPrints < 10) {
                          pTVar19 = tcu::TestContext::getLog
                                              ((this->super_TestCase).super_TestCase.super_TestNode.
                                               m_testCtx);
                          tcu::TestLog::operator<<
                                    (&local_6a0,pTVar19,(BeginMessageToken *)&tcu::TestLog::Message)
                          ;
                          pMVar23 = tcu::MessageBuilder::operator<<
                                              (&local_6a0,
                                               (char (*) [36])"ERROR: comparison failed at offset ")
                          ;
                          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,refValue.m_data + 1);
                          pMVar23 = tcu::MessageBuilder::operator<<
                                              (pMVar23,(char (*) [12])0x2b79cc4);
                          LogComps::LogComps(&local_6b0,(UVec3 *)((long)&resPtr + 4),iVar8);
                          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_6b0);
                          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [7])0x2c59494)
                          ;
                          LogComps::LogComps(&local_6c0,(UVec3 *)local_51c,iVar8);
                          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_6c0);
                          tcu::MessageBuilder::operator<<
                                    (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
                          tcu::MessageBuilder::~MessageBuilder(&local_6a0);
                        }
                        else if (maxLogPrints == 10) {
                          pTVar19 = tcu::TestContext::getLog
                                              ((this->super_TestCase).super_TestCase.super_TestNode.
                                               m_testCtx);
                          tcu::TestLog::operator<<
                                    (&local_840,pTVar19,(BeginMessageToken *)&tcu::TestLog::Message)
                          ;
                          pMVar23 = tcu::MessageBuilder::operator<<
                                              (&local_840,(char (*) [4])0x2b51841);
                          tcu::MessageBuilder::operator<<
                                    (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
                          tcu::MessageBuilder::~MessageBuilder(&local_840);
                        }
                        maxLogPrints = maxLogPrints + 1;
                      }
                    }
                  }
                }
              }
            }
          }
          pTVar19 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_9c0,pTVar19,(BeginMessageToken *)&tcu::TestLog::Message);
          local_9c4 = outVarInfo._76_4_ - maxLogPrints;
          pMVar23 = tcu::MessageBuilder::operator<<(&local_9c0,&local_9c4);
          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [4])0x2b88b0c);
          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(uint *)&outVarInfo.field_0x4c);
          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [15])" values passed");
          tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_9c0);
          if (0 < maxLogPrints) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Comparison failed");
          }
          (*gl_00->unmapBuffer)(0x90d2);
          this->m_subCaseNdx = this->m_subCaseNdx + 1;
          iVar8 = this->m_subCaseNdx;
          sVar25 = std::
                   vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
                   ::size(&this->m_subCases);
          bVar7 = false;
          if (iVar8 < (int)sVar25) {
            qVar18 = tcu::TestContext::getTestResult
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            bVar7 = qVar18 == QP_TEST_RESULT_PASS;
          }
          glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                    ((TypedObjectWrapper<(glu::ObjectType)1> *)local_198);
          glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_178);
          tcu::ScopedLogSection::~ScopedLogSection(&local_18);
          return (uint)bVar7;
        }
      }
      pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar22,(char *)0x0,"ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                 ,0xf5);
      __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar22,(char *)0x0,"outVarInfo.arraySize == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
             ,0xdd);
  __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ComputeBuiltinVarCase::IterateResult ComputeBuiltinVarCase::iterate (void)
{
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Iteration") + de::toString(m_subCaseNdx), string("Iteration ") + de::toString(m_subCaseNdx));
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const SubCase&					subCase			= m_subCases[m_subCaseNdx];
	const deUint32					program			= getProgram(subCase.localSize);

	const tcu::UVec3				globalSize		= subCase.localSize*subCase.numWorkGroups;
	const tcu::UVec2				stride			(globalSize[0]*globalSize[1], globalSize[0]);
	const deUint32					numInvocations	= subCase.localSize[0]*subCase.localSize[1]*subCase.localSize[2]*subCase.numWorkGroups[0]*subCase.numWorkGroups[1]*subCase.numWorkGroups[2];

	const deUint32					outVarIndex		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "Output.result");
	const InterfaceVariableInfo		outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarIndex);
	const deUint32					bufferSize		= numInvocations*outVarInfo.arrayStride;
	Buffer							outputBuffer	(m_context.getRenderContext());

	TCU_CHECK(outVarInfo.arraySize == 0); // Unsized variable.

	m_testCtx.getLog() << TestLog::Message << "Number of work groups = " << subCase.numWorkGroups << TestLog::EndMessage
					   << TestLog::Message << "Work group size = " << subCase.localSize << TestLog::EndMessage;

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)bufferSize, DE_NULL, GL_STREAM_READ);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");

	gl.useProgram(program);
	gl.uniform2uiv(gl.getUniformLocation(program, "u_stride"), 1, stride.getPtr());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program setup failed");

	gl.dispatchCompute(subCase.numWorkGroups[0], subCase.numWorkGroups[1], subCase.numWorkGroups[2]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() failed");

	{
		const void*	ptr				= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufferSize, GL_MAP_READ_BIT);
		int			numFailed		= 0;
		const int	numScalars		= getDataTypeScalarSize(m_varType);
		const int	maxLogPrints	= 10;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");
		TCU_CHECK(ptr);

		for (deUint32 groupZ = 0; groupZ < subCase.numWorkGroups.z(); groupZ++)
		for (deUint32 groupY = 0; groupY < subCase.numWorkGroups.y(); groupY++)
		for (deUint32 groupX = 0; groupX < subCase.numWorkGroups.x(); groupX++)
		for (deUint32 localZ = 0; localZ < subCase.localSize.z(); localZ++)
		for (deUint32 localY = 0; localY < subCase.localSize.y(); localY++)
		for (deUint32 localX = 0; localX < subCase.localSize.x(); localX++)
		{
			const UVec3			refGroupID		(groupX, groupY, groupZ);
			const UVec3			refLocalID		(localX, localY, localZ);
			const UVec3			refGlobalID		= refGroupID * subCase.localSize + refLocalID;
			const deUint32		refOffset		= stride.x()*refGlobalID.z() + stride.y()*refGlobalID.y() + refGlobalID.x();
			const UVec3			refValue		= computeReference(subCase.numWorkGroups, subCase.localSize, refGroupID, refLocalID);

			const deUint32*		resPtr			= (const deUint32*)((const deUint8*)ptr + refOffset*outVarInfo.arrayStride);
			const UVec3			resValue		= readResultVec(resPtr, numScalars);

			if (!compareComps(refValue, resValue, numScalars))
			{
				if (numFailed < maxLogPrints)
					m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed at offset " << refOffset
														   << ": expected " << LogComps(refValue, numScalars)
														   << ", got " << LogComps(resValue, numScalars)
									   << TestLog::EndMessage;
				else if (numFailed == maxLogPrints)
					m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}

		m_testCtx.getLog() << TestLog::Message << (numInvocations-numFailed) << " / " << numInvocations << " values passed" << TestLog::EndMessage;

		if (numFailed > 0)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Comparison failed");

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	}

	m_subCaseNdx += 1;
	return (m_subCaseNdx < (int)m_subCases.size() && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS) ? CONTINUE : STOP;
}